

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O2

int coda_ascbin_cursor_goto_array_element_by_index(coda_cursor *cursor,long index)

{
  int64_t *piVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  coda_type *pcVar5;
  long lVar6;
  coda_type *pcVar7;
  long in_FS_OFFSET;
  long num_elements;
  long local_38;
  
  iVar2 = cursor->n;
  lVar3 = (long)iVar2;
  pcVar7 = (coda_type *)cursor->stack[lVar3 + -1].type;
  if (99 < pcVar7->format) {
    pcVar7 = *(coda_type **)&pcVar7->type_class;
  }
  if (*(int *)(in_FS_OFFSET + -0x1208) == 0) {
LAB_0017ada9:
    uVar4 = (ulong)(iVar2 + 1U);
    cursor->n = iVar2 + 1U;
    lVar3 = cursor->stack[lVar3 + -1].bit_offset;
    cursor->stack[iVar2].bit_offset = lVar3;
    pcVar5 = *(coda_type **)(pcVar7 + 1);
    if (pcVar5->bit_size < 0) {
      lVar6 = 0;
      lVar3 = 0;
      if (0 < index) {
        lVar3 = index;
      }
      local_38 = index;
      for (; lVar3 != lVar6; lVar6 = lVar6 + 1) {
        iVar2 = (int)uVar4 + -1;
        cursor->stack[iVar2].type = (coda_dynamic_type_struct *)*(coda_type **)(pcVar7 + 1);
        cursor->stack[iVar2].index = lVar6;
        iVar2 = coda_cursor_get_bit_size(cursor,&num_elements);
        if (iVar2 != 0) {
          cursor->n = cursor->n + -1;
          goto LAB_0017ae82;
        }
        uVar4 = (ulong)cursor->n;
        piVar1 = &cursor->stack[uVar4 - 1].bit_offset;
        *piVar1 = *piVar1 + num_elements;
      }
      pcVar5 = *(coda_type **)(pcVar7 + 1);
      iVar2 = (int)uVar4 + -1;
      index = local_38;
    }
    else {
      cursor->stack[iVar2].bit_offset = pcVar5->bit_size * index + lVar3;
    }
    cursor->stack[iVar2].type = (coda_dynamic_type_struct *)pcVar5;
    cursor->stack[iVar2].index = index;
    iVar2 = 0;
  }
  else {
    iVar2 = coda_cursor_get_num_elements(cursor,&num_elements);
    if (iVar2 == 0) {
      if (-1 < index && index < num_elements) {
        iVar2 = cursor->n;
        lVar3 = (long)iVar2;
        goto LAB_0017ada9;
      }
      coda_set_error(-0x6b,"array index (%ld) exceeds array range [0:%ld)",index);
    }
LAB_0017ae82:
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int coda_ascbin_cursor_goto_array_element_by_index(coda_cursor *cursor, long index)
{
    coda_type_array *array;
    long i;

    array = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    /* check the range for index */
    if (coda_option_perform_boundary_checks)
    {
        long num_elements;

        if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
        {
            return -1;
        }
        if (index < 0 || index >= num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array index (%ld) exceeds array range [0:%ld)", index,
                           num_elements);
            return -1;
        }
    }

    cursor->n++;
    cursor->stack[cursor->n - 1].bit_offset = cursor->stack[cursor->n - 2].bit_offset;

    if (array->base_type->bit_size >= 0)
    {
        /* if the array base type is simple, do a calculated index calculation. */
        cursor->stack[cursor->n - 1].bit_offset += index * array->base_type->bit_size;
    }
    else        /* not a simple base type, so walk the elements. */
    {
        for (i = 0; i < index; i++)
        {
            int64_t bit_size;

            cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)array->base_type;
            cursor->stack[cursor->n - 1].index = i;
            if (coda_cursor_get_bit_size(cursor, &bit_size) != 0)
            {
                cursor->n--;
                return -1;
            }
            cursor->stack[cursor->n - 1].bit_offset += bit_size;
        }
    }
    cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)array->base_type;
    cursor->stack[cursor->n - 1].index = index;

    return 0;
}